

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codecfactory.cpp
# Opt level: O2

unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
FastPForLib::simdgroupsimple_ringbuf_codec(void)

{
  undefined8 *puVar1;
  __uniq_ptr_data<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>,_true,_true>
  in_RDI;
  
  puVar1 = (undefined8 *)operator_new(0x18);
  *(undefined8 **)
   in_RDI.
   super___uniq_ptr_impl<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
   ._M_t.
   super__Tuple_impl<0UL,_FastPForLib::IntegerCODEC_*,_std::default_delete<FastPForLib::IntegerCODEC>_>
   .super__Head_base<0UL,_FastPForLib::IntegerCODEC_*,_false>._M_head_impl = puVar1;
  *puVar1 = &PTR_encodeArray_001c2c20;
  puVar1[1] = &PTR_encodeArray_001c2c90;
  puVar1[2] = &PTR_encodeArray_001c1550;
  return (__uniq_ptr_data<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>,_true,_true>
          )(tuple<FastPForLib::IntegerCODEC_*,_std::default_delete<FastPForLib::IntegerCODEC>_>)
           in_RDI.
           super___uniq_ptr_impl<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
           ._M_t.
           super__Tuple_impl<0UL,_FastPForLib::IntegerCODEC_*,_std::default_delete<FastPForLib::IntegerCODEC>_>
           .super__Head_base<0UL,_FastPForLib::IntegerCODEC_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<IntegerCODEC> simdgroupsimple_ringbuf_codec() {
  return make_unique<CompositeCodec<SIMDGroupSimple<true, true>, VariableByte>>();
}